

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

void __thiscall
re2c::Node::cover<unsigned_short,unsigned_char>
          (Node *this,path_t *prefix,FILE *input,FILE *keys,covers_t *size)

{
  rule_t rVar1;
  bool bVar2;
  covers_t y;
  u32lim_t<1073741824U> uVar3;
  pointer ppVar4;
  path_t *ppVar5;
  byte local_c9;
  undefined1 local_a0 [8];
  path_t new_prefix;
  _Self local_60;
  iterator i;
  local_inc _;
  covers_t *size_local;
  FILE *keys_local;
  FILE *input_local;
  path_t *prefix_local;
  Node *this_local;
  
  bVar2 = end(this);
  if ((bVar2) && (this->suffix == (path_t *)0x0)) {
    ppVar5 = (path_t *)operator_new(0x38);
    path_t::path_t(ppVar5,this->rule,(bool)(this->ctx & 1));
    this->suffix = ppVar5;
  }
  if (this->suffix == (path_t *)0x0) {
    if (this->loop < 2) {
      local_increment_t<unsigned_char>::local_increment_t
                ((local_increment_t<unsigned_char> *)&i,&this->loop);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           ::begin(&this->arcs);
      while( true ) {
        new_prefix.ctx_pos =
             (size_t)std::
                     map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                     ::end(&this->arcs);
        bVar2 = std::operator!=(&local_60,(_Self *)&new_prefix.ctx_pos);
        local_c9 = 0;
        if (bVar2) {
          bVar2 = u32lim_t<1073741824U>::overflow(size);
          local_c9 = bVar2 ^ 0xff;
        }
        if ((local_c9 & 1) == 0) break;
        path_t::path_t((path_t *)local_a0,prefix);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_60);
        rVar1 = ppVar4->first->rule;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_60);
        bVar2 = ppVar4->first->ctx;
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_60);
        path_t::extend((path_t *)local_a0,rVar1,(bool)(bVar2 & 1),&ppVar4->second);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_60);
        cover<unsigned_short,unsigned_char>(ppVar4->first,(path_t *)local_a0,input,keys,size);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator->(&local_60);
        if ((ppVar4->first->suffix != (path_t *)0x0) && (this->suffix == (path_t *)0x0)) {
          ppVar5 = (path_t *)operator_new(0x38);
          path_t::path_t(ppVar5,this->rule,(bool)(this->ctx & 1));
          this->suffix = ppVar5;
          ppVar5 = this->suffix;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator->(&local_60);
          rVar1 = ppVar4->first->rule;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator->(&local_60);
          bVar2 = ppVar4->first->ctx;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator->(&local_60);
          path_t::extend(ppVar5,rVar1,(bool)(bVar2 & 1),&ppVar4->second);
          ppVar5 = this->suffix;
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator->(&local_60);
          path_t::append(ppVar5,ppVar4->first->suffix);
        }
        path_t::~path_t((path_t *)local_a0);
        std::
        _Rb_tree_iterator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator++(&local_60);
      }
      local_increment_t<unsigned_char>::~local_increment_t((local_increment_t<unsigned_char> *)&i);
    }
  }
  else {
    path_t::append(prefix,this->suffix);
    uVar3.value = size->value;
    y = cover_one<unsigned_short,unsigned_char>(input,keys,prefix);
    uVar3 = operator+(uVar3,y.value);
    size->value = uVar3.value;
  }
  return;
}

Assistant:

void Node::cover (path_t & prefix, FILE * input, FILE * keys, covers_t &size)
{
	if (end () && suffix == NULL)
	{
		suffix = new path_t (rule, ctx);
	}
	if (suffix != NULL)
	{
		prefix.append (suffix);
		size = size + cover_one<cunit_t, key_t> (input, keys, prefix);
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcs_t::iterator i = arcs.begin ();
			i != arcs.end () && !size.overflow(); ++i)
		{
			path_t new_prefix = prefix;
			new_prefix.extend (i->first->rule, i->first->ctx, &i->second);
			i->first->cover<cunit_t, key_t> (new_prefix, input, keys, size);
			if (i->first->suffix != NULL && suffix == NULL)
			{
				suffix = new path_t (rule, ctx);
				suffix->extend (i->first->rule, i->first->ctx, &i->second);
				suffix->append (i->first->suffix);
			}
		}
	}
}